

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  pointer pnVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  long lVar6;
  Real eps;
  bool bVar7;
  long lVar8;
  long lVar9;
  Item *pIVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  iVar2 = *(x->super_IdxSet).idx;
  pnVar4 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar2].m_backend.data;
  local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
  local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x20);
  local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x30);
  local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  local_d8.exp = pnVar4[iVar2].m_backend.exp;
  local_d8.neg = pnVar4[iVar2].m_backend.neg;
  local_d8.fpclass = pnVar4[iVar2].m_backend.fpclass;
  local_d8.prec_elem = pnVar4[iVar2].m_backend.prec_elem;
  pIVar10 = (A->set).theitem + (A->set).thekey[iVar2].idx;
  local_88.m_backend.data._M_elems._0_8_ = local_d8.data._M_elems._0_8_;
  local_88.m_backend.data._M_elems._8_8_ = local_d8.data._M_elems._8_8_;
  local_88.m_backend.data._M_elems._16_8_ = local_d8.data._M_elems._16_8_;
  local_88.m_backend.data._M_elems._24_8_ = local_d8.data._M_elems._24_8_;
  local_88.m_backend.data._M_elems._32_8_ = local_d8.data._M_elems._32_8_;
  local_88.m_backend.data._M_elems._40_8_ = local_d8.data._M_elems._40_8_;
  local_88.m_backend.data._M_elems._48_8_ = local_d8.data._M_elems._48_8_;
  local_88.m_backend.data._M_elems._56_8_ = local_d8.data._M_elems._56_8_;
  local_88.m_backend.exp = local_d8.exp;
  local_88.m_backend.neg = local_d8.neg;
  local_88.m_backend.fpclass = local_d8.fpclass;
  local_88.m_backend.prec_elem = local_d8.prec_elem;
  eps = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  bVar7 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_88,eps);
  if (!bVar7) {
    uVar3 = (pIVar10->data).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused;
    uVar11 = (ulong)uVar3;
    if (uVar11 != 0) {
      *(uint *)(this + 8) = uVar3;
      lVar9 = uVar11 * 0x54;
      for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        pNVar5 = (pIVar10->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(undefined4 *)(*(long *)(this + 0x10) + -4 + uVar11 * 4) =
             *(undefined4 *)((long)(&pNVar5[-1].val + 1) + lVar9);
        local_128.fpclass = cpp_dec_float_finite;
        local_128.prec_elem = 0x10;
        local_128.data._M_elems[0] = 0;
        local_128.data._M_elems[1] = 0;
        local_128.data._M_elems[2] = 0;
        local_128.data._M_elems[3] = 0;
        local_128.data._M_elems[4] = 0;
        local_128.data._M_elems[5] = 0;
        local_128.data._M_elems[6] = 0;
        local_128.data._M_elems[7] = 0;
        local_128.data._M_elems[8] = 0;
        local_128.data._M_elems[9] = 0;
        local_128.data._M_elems[10] = 0;
        local_128.data._M_elems[0xb] = 0;
        local_128.data._M_elems[0xc] = 0;
        local_128.data._M_elems[0xd] = 0;
        local_128.data._M_elems._56_5_ = 0;
        local_128.data._M_elems[0xf]._1_3_ = 0;
        local_128.exp = 0;
        local_128.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_128,&local_d8,
                   (cpp_dec_float<100U,_int,_void> *)((long)&pNVar5[-1].val.m_backend.data + lVar9))
        ;
        lVar6 = *(long *)(this + 0x20);
        lVar8 = (long)*(int *)((long)(&pNVar5[-1].val + 1) + lVar9) * 0x50;
        puVar1 = (uint *)(lVar6 + 0x30 + lVar8);
        *(undefined8 *)puVar1 = local_128.data._M_elems._48_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_128.data._M_elems[0xf]._1_3_,local_128.data._M_elems._56_5_);
        puVar1 = (uint *)(lVar6 + 0x20 + lVar8);
        *(undefined8 *)puVar1 = local_128.data._M_elems._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._40_8_;
        puVar1 = (uint *)(lVar6 + 0x10 + lVar8);
        *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._24_8_;
        *(undefined8 *)(lVar6 + lVar8) = local_128.data._M_elems._0_8_;
        *(undefined8 *)((uint *)(lVar6 + lVar8) + 2) = local_128.data._M_elems._8_8_;
        *(int *)(lVar6 + 0x40 + lVar8) = local_128.exp;
        *(bool *)(lVar6 + 0x44 + lVar8) = local_128.neg;
        *(undefined8 *)(lVar6 + 0x48 + lVar8) = local_128._72_8_;
        lVar9 = lVar9 + -0x54;
      }
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}